

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O3

int dasm_encode(BuildCtx *ctx,void *buffer)

{
  uint uVar1;
  dasm_State *pdVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  byte bVar8;
  int iVar9;
  uint *puVar10;
  uint *puVar11;
  byte *pbVar12;
  uint *puVar13;
  long lVar14;
  byte *pbVar15;
  uint *puVar16;
  byte bVar17;
  byte *pbVar18;
  uint *puVar19;
  char cVar20;
  uint uVar21;
  ulong __n;
  uint *__s;
  
  pdVar2 = ctx->D;
  iVar4 = pdVar2->maxsection;
  __s = (uint *)buffer;
  if (iVar4 < 1) {
LAB_0010679a:
    return (uint)((uint *)((long)buffer + pdVar2->codesize) != __s) << 0x19;
  }
  lVar14 = 0;
LAB_00106272:
  puVar13 = (uint *)pdVar2->sections[lVar14].buf;
  puVar11 = (uint *)(pdVar2->sections[lVar14].rbuf + pdVar2->sections[lVar14].pos);
  if (puVar13 != puVar11) {
LAB_0010629b:
    puVar16 = (uint *)0x0;
    pbVar18 = pdVar2->actionlist + (int)*puVar13;
    puVar13 = puVar13 + 1;
switchD_001062eb_caseD_fd:
    pbVar12 = pbVar18;
    puVar10 = puVar16;
    bVar8 = *pbVar12;
    __n = 0;
    if ((byte)(bVar8 + 0x17) < 0x12) {
      __n = (ulong)*puVar13;
      puVar13 = puVar13 + 1;
    }
    uVar21 = (uint)__n;
    pbVar15 = pbVar12 + 1;
    if (bVar8 - 0xe9 < 0x17) goto code_r0x001062de;
    goto LAB_001065fa;
  }
  goto LAB_00106786;
code_r0x001062de:
  cVar20 = (char)__n;
  iVar4 = (int)__s;
  puVar16 = __s;
  pbVar18 = pbVar15;
  puVar19 = puVar13;
  switch((uint)bVar8) {
  case 0xe9:
    puVar16 = puVar10;
    if (puVar10 == (uint *)0x0) {
      puVar16 = __s;
    }
    puVar10 = (uint *)0x0;
    if ((*pbVar15 & 0xfe) == 0xee) {
      puVar10 = puVar16;
    }
    if (uVar21 == 0) {
      bVar8 = *(byte *)((long)puVar16 + -1);
      bVar17 = bVar8 & 7;
      if (bVar17 == 4) {
        bVar17 = (byte)*puVar16 & 7;
      }
      if (bVar17 != 5) {
        *(byte *)((long)puVar16 + -1) = bVar8 + 0x80;
        puVar16 = puVar10;
        goto switchD_001062eb_caseD_fd;
      }
    }
    else {
      if ((int)cVar20 != uVar21) break;
      bVar8 = *(byte *)((long)puVar16 + -1);
    }
    *(byte *)((long)puVar16 + -1) = bVar8 - 0x40;
    goto LAB_00106707;
  default:
    goto LAB_00106707;
  case 0xec:
    goto switchD_001062eb_caseD_ec;
  case 0xed:
    break;
  case 0xee:
    if ((int)cVar20 == uVar21) {
LAB_001065de:
      if (puVar10 == (uint *)0x0) {
        puVar10 = __s;
      }
      *(byte *)((long)puVar10 + -2) = *(byte *)((long)puVar10 + -2) + 2;
      puVar10 = (uint *)0x0;
      goto LAB_00106707;
    }
    puVar10 = (uint *)0x0;
    goto switchD_001062eb_caseD_ec;
  case 0xef:
    if ((int)cVar20 == uVar21) goto LAB_001065de;
    puVar10 = (uint *)0x0;
    break;
  case 0xf0:
    bVar8 = pbVar12[1];
    pbVar18 = (byte *)((long)__s - (ulong)(bVar8 & 7));
    if (((__n & 8) == 0) || (0x9f < bVar8)) {
      if ((__n & 0x10) != 0) {
        if ((char)*pbVar18 < '\0') {
          *pbVar18 = 0xc5;
          pbVar18[1] = pbVar18[1] & 0x80 | pbVar18[2];
          pbVar18 = pbVar18 + 2;
        }
        if (pbVar18 + 1 < __s) {
          memmove(pbVar18,pbVar18 + 1,(size_t)(~(ulong)pbVar18 + (long)__s));
        }
        if (puVar10 != (uint *)0x0) {
          puVar10 = (uint *)((long)puVar10 + -1);
        }
        __s = (uint *)((long)__s + -1);
        __n = (ulong)(uVar21 & 7);
      }
      if (bVar8 < 0xc0) goto LAB_00106728;
      __n = (ulong)(uint)((int)__n << 4);
    }
    else {
      if ((char)*pbVar18 < '\0') {
        pbVar18[1] = pbVar18[1] ^ ' ' << (bVar8 >> 6);
      }
      else {
        *pbVar18 = *pbVar18 ^ '\x01' << (bVar8 >> 6);
      }
      __n = (ulong)(uVar21 & 7);
LAB_00106728:
      if (bVar8 < 0x40) {
        if (((int)__n == 4) && (bVar8 < 0x20)) {
          *(byte *)((long)__s + -1) = *(byte *)((long)__s + -1) ^ 4;
          *(byte *)__s = 0x20;
          __s = (uint *)((long)__s + 1);
          __n = 4;
        }
      }
      else {
        __n = (ulong)(uint)((int)__n << 3);
      }
    }
    *(byte *)((long)__s + -1) = *(byte *)((long)__s + -1) ^ (byte)__n;
    goto LAB_0010675a;
  case 0xf1:
    puVar16 = puVar10;
    pbVar18 = pbVar12 + 2;
    if (uVar21 == 0) goto switchD_001062eb_caseD_fd;
    memset(__s,(uint)*pbVar15,__n);
    __s = (uint *)((long)__s + (ulong)(uVar21 - 1) + 1);
    goto LAB_0010675a;
  case 0xf2:
  case 0xf9:
    goto switchD_001062eb_caseD_f2;
  case 0xf3:
    goto LAB_0010661b;
  case 0xf4:
    pbVar15 = pbVar12 + 2;
    if (-1 < (int)uVar21) goto LAB_00106473;
    puVar13 = puVar13 + 1;
    uVar21 = *(uint *)(pdVar2->globals + (int)(-10 - uVar21));
LAB_0010661b:
    uVar21 = (uVar21 - iVar4) - 4;
    break;
  case 0xf5:
LAB_00106473:
    puVar19 = puVar13 + 1;
    piVar3 = pdVar2->sections[(int)uVar21 >> 0x18].rbuf;
    iVar9 = piVar3[(int)uVar21];
    if (iVar9 < 0) {
      uVar21 = piVar3[(long)(int)uVar21 + 1];
      puVar13 = puVar19;
      goto LAB_0010661b;
    }
    uVar1 = *puVar13;
    uVar21 = (uVar1 + ((int)buffer - iVar4) + iVar9) - 4;
    __n = (ulong)uVar21;
    puVar13 = puVar19;
    if (uVar1 != 0) {
      if (uVar1 == 4) {
        *(byte *)((long)__s + -2) = *(byte *)((long)__s + -1) - 0x10;
        __s = (uint *)((long)__s + -1);
      }
      else {
        *(byte *)((long)__s + -1) = 0xeb;
      }
LAB_00106707:
      *(byte *)__s = (byte)__n;
      __s = (uint *)((long)__s + 1);
      puVar16 = puVar10;
      pbVar18 = pbVar15;
      puVar13 = puVar19;
      goto switchD_001062eb_caseD_fd;
    }
    break;
  case 0xf6:
    pbVar15 = pbVar12 + 2;
    if (-1 < (int)uVar21) goto LAB_001063ba;
    *(void **)__s = pdVar2->globals[(int)(-10 - uVar21)];
    __s = __s + 2;
    goto LAB_0010675a;
  case 0xf7:
LAB_001063ba:
    piVar3 = pdVar2->sections[(int)uVar21 >> 0x18].rbuf;
    lVar6 = (long)piVar3[(int)uVar21];
    if (lVar6 < 0) {
      lVar6 = (long)piVar3[(long)(int)uVar21 + 1];
    }
    else {
      lVar6 = lVar6 + (long)buffer;
    }
    *(long *)__s = lVar6;
    __s = __s + 2;
    puVar16 = puVar10;
    pbVar18 = pbVar15;
    goto switchD_001062eb_caseD_fd;
  case 0xf8:
    puVar16 = puVar10;
    pbVar18 = pbVar12 + 2;
    if (pbVar12[1] < 10) goto switchD_001062eb_caseD_fd;
    if (pbVar12[2] == 0xf2) {
      uVar21 = *puVar13;
    }
    pdVar2->globals[pbVar12[1] - 10] = (void *)((long)(int)uVar21 + (long)buffer);
    goto LAB_0010675a;
  case 0xfa:
    bVar8 = pbVar12[1];
    puVar16 = puVar10;
    pbVar18 = pbVar12 + 2;
    if ((iVar4 - (int)buffer & (uint)bVar8) == 0) goto switchD_001062eb_caseD_fd;
    pbVar18 = (byte *)((1 - (long)buffer) + (long)__s);
    do {
      *(byte *)__s = 0x90;
      __s = (uint *)((long)__s + 1);
      uVar21 = (uint)pbVar18;
      pbVar18 = pbVar18 + 1;
    } while ((uVar21 & bVar8) != 0);
LAB_0010675a:
    puVar16 = puVar10;
    pbVar18 = pbVar12 + 2;
    goto switchD_001062eb_caseD_fd;
  case 0xfb:
    iVar9 = ctx->nreloc;
    if (199 < iVar9) {
      dasm_encode_cold_1();
    }
    bVar8 = *pbVar15;
    bVar17 = pbVar12[2];
    iVar5 = relocmap[bVar17];
    if (iVar5 < 0) {
      relocmap[bVar17] = ctx->nrelocsym;
      pcVar7 = sym_decorate((BuildCtx *)(ulong)ctx->mode,"",extnames[bVar17]);
      iVar9 = ctx->nrelocsym;
      ctx->relocsym[iVar9] = pcVar7;
      ctx->nrelocsym = iVar9 + 1;
      iVar9 = ctx->nreloc;
      iVar5 = relocmap[bVar17];
    }
    ctx->reloc[iVar9].ofs = iVar4 - *(int *)&ctx->code;
    ctx->reloc[iVar9].sym = iVar5;
    ctx->reloc[iVar9].type = (uint)bVar8;
    ctx->nreloc = iVar9 + 1;
    pbVar15 = pbVar12 + 3;
    uVar21 = 0;
    break;
  case 0xfc:
    bVar8 = pbVar12[1];
    pbVar15 = pbVar12 + 2;
LAB_001065fa:
    *(byte *)__s = bVar8;
    __s = (uint *)((long)__s + 1);
    goto switchD_001062eb_caseD_f2;
  case 0xfd:
    goto switchD_001062eb_caseD_fd;
  case 0xfe:
  case 0xff:
    goto switchD_001062eb_caseD_fe;
  }
  *__s = uVar21;
  __s = __s + 1;
switchD_001062eb_caseD_f2:
  puVar16 = puVar10;
  pbVar18 = pbVar15;
  goto switchD_001062eb_caseD_fd;
switchD_001062eb_caseD_fe:
  if (puVar13 == puVar11) goto code_r0x0010677e;
  goto LAB_0010629b;
code_r0x0010677e:
  iVar4 = pdVar2->maxsection;
LAB_00106786:
  lVar14 = lVar14 + 1;
  if (iVar4 <= lVar14) goto LAB_0010679a;
  goto LAB_00106272;
switchD_001062eb_caseD_ec:
  *(short *)__s = (short)__n;
  __s = (uint *)((long)__s + 2);
  goto switchD_001062eb_caseD_f2;
}

Assistant:

int dasm_encode(Dst_DECL, void *buffer)
{
  dasm_State *D = Dst_REF;
  unsigned char *base = (unsigned char *)buffer;
  unsigned char *cp = base;
  int secnum;

  /* Encode all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->buf;
    int *endb = sec->rbuf + sec->pos;

    while (b != endb) {
      dasm_ActList p = D->actionlist + *b++;
      unsigned char *mark = NULL;
      while (1) {
	int action = *p++;
	int n = (action >= DASM_DISP && action <= DASM_ALIGN) ? *b++ : 0;
	switch (action) {
	case DASM_DISP: if (!mark) mark = cp; {
	  unsigned char *mm = mark;
	  if (*p != DASM_IMM_DB && *p != DASM_IMM_WB) mark = NULL;
	  if (n == 0) { int mrm = mm[-1]&7; if (mrm == 4) mrm = mm[0]&7;
	    if (mrm != 5) { mm[-1] -= 0x80; break; } }
	  if (((n+128) & -256) != 0) goto wd; else mm[-1] -= 0x40;
	}
	  /* fallthrough */
	case DASM_IMM_S: case DASM_IMM_B: wb: dasmb(n); break;
	case DASM_IMM_DB: if (((n+128)&-256) == 0) {
	    db: if (!mark) mark = cp; mark[-2] += 2; mark = NULL; goto wb;
	  } else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_D: wd: dasmd(n); break;
	case DASM_IMM_WB: if (((n+128)&-256) == 0) goto db; else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_W: dasmw(n); break;
	case DASM_VREG: {
	  int t = *p++;
	  unsigned char *ex = cp - (t&7);
	  if ((n & 8) && t < 0xa0) {
	    if (*ex & 0x80) ex[1] ^= 0x20 << (t>>6); else *ex ^= 1 << (t>>6);
	    n &= 7;
	  } else if (n & 0x10) {
	    if (*ex & 0x80) {
	      *ex = 0xc5; ex[1] = (ex[1] & 0x80) | ex[2]; ex += 2;
	    }
	    while (++ex < cp) ex[-1] = *ex;
	    if (mark) mark--;
	    cp--;
	    n &= 7;
	  }
	  if (t >= 0xc0) n <<= 4;
	  else if (t >= 0x40) n <<= 3;
	  else if (n == 4 && t < 0x20) { cp[-1] ^= n; *cp++ = 0x20; }
	  cp[-1] ^= n;
	  break;
	}
	case DASM_REL_LG: p++; if (n >= 0) goto rel_pc;
	  b++; n = (int)(ptrdiff_t)D->globals[-n-10];
	  /* fallthrough */
	case DASM_REL_A: rel_a:
	  n -= (unsigned int)(ptrdiff_t)(cp+4); goto wd; /* !x64 */
	case DASM_REL_PC: rel_pc: {
	  int shrink = *b++;
	  int *pb = DASM_POS2PTR(D, n); if (*pb < 0) { n = pb[1]; goto rel_a; }
	  n = *pb - ((int)(cp-base) + 4-shrink);
	  if (shrink == 0) goto wd;
	  if (shrink == 4) { cp--; cp[-1] = *cp-0x10; } else cp[-1] = 0xeb;
	  goto wb;
	}
	case DASM_IMM_LG:
	  p++;
	  if (n < 0) { dasma((ptrdiff_t)D->globals[-n-10]); break; }
	  /* fallthrough */
	case DASM_IMM_PC: {
	  int *pb = DASM_POS2PTR(D, n);
	  dasma(*pb < 0 ? (ptrdiff_t)pb[1] : (*pb + (ptrdiff_t)base));
	  break;
	}
	case DASM_LABEL_LG: {
	  int idx = *p++;
	  if (idx >= 10)
	    D->globals[idx-10] = (void *)(base + (*p == DASM_SETLABEL ? *b : n));
	  break;
	}
	case DASM_LABEL_PC: case DASM_SETLABEL: break;
	case DASM_SPACE: { int fill = *p++; while (n--) *cp++ = fill; break; }
	case DASM_ALIGN:
	  n = *p++;
	  while (((cp-base) & n)) *cp++ = 0x90; /* nop */
	  break;
	case DASM_EXTERN: n = DASM_EXTERN(Dst, cp, p[1], *p); p += 2; goto wd;
	case DASM_MARK: mark = cp; break;
	case DASM_ESC: action = *p++;
	  /* fallthrough */
	default: *cp++ = action; break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	}
      }
      stop: (void)0;
    }
  }

  if (base + D->codesize != cp)  /* Check for phase errors. */
    return DASM_S_PHASE;
  return DASM_S_OK;
}